

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void Cmd_clear(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  FConsoleBuffer *this;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&NotifyStrings[0].TimeOut + lVar2) = 0;
    this = conbuffer;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  if (conbuffer != (FConsoleBuffer *)0x0) {
    conbuffer->mBufferWasCleared = true;
    uVar1 = (this->mConsoleText).Count;
    if (uVar1 != 0) {
      TArray<FString,_FString>::DoDelete(&this->mConsoleText,0,uVar1 - 1);
      (this->mConsoleText).Count = 0;
    }
  }
  return;
}

Assistant:

CCMD (clear)
{
	C_FlushDisplay ();
	ClearConsole ();
}